

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::Simulator(Simulator *this,IR *ir)

{
  IR *ir_local;
  Simulator *this_local;
  
  IR::IR(&this->ir_,ir);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::deque(&this->stack_);
  ScopeTree::ScopeTree(&this->tree_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  ::map(&this->func_table_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->label_table_);
  this->eip_ = 0;
  this->inloop_ = 0;
  return;
}

Assistant:

Simulator(const IR &ir) : ir_(ir), eip_(0), inloop_(false) { }